

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdHist.c
# Opt level: O3

void Cmd_HistoryAddCommand(Abc_Frame_t *p,char *command)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  char *__s1;
  Vec_Ptr_t *p_00;
  uint uVar5;
  void **ppvVar6;
  char Buffer [32768];
  undefined8 local_8040;
  short local_8038;
  char cStack_8036;
  undefined1 uStack_8035;
  char local_8034;
  undefined2 uStack_8033;
  
  if (p->fBatchMode != 0) {
    return;
  }
  sVar3 = strlen(command);
  strcpy((char *)&local_8038,command);
  lVar4 = (long)((int)sVar3 + -1);
  if (*(char *)((long)&local_8038 + lVar4) == '\n') {
    *(undefined1 *)((long)&local_8038 + lVar4) = 0;
  }
  sVar3 = strlen((char *)&local_8038);
  if (sVar3 < 4) {
    return;
  }
  if (cStack_8036 == 't' && local_8038 == 0x6573) {
    return;
  }
  iVar2 = CONCAT13(uStack_8035,CONCAT12(cStack_8036,local_8038));
  if (local_8034 == 't' && iVar2 == 0x65736e75) {
    return;
  }
  if (iVar2 == 0x656d6974) {
    return;
  }
  if (iVar2 == 0x74697571) {
    return;
  }
  if (local_8034 == 's' && CONCAT13(uStack_8035,CONCAT12(cStack_8036,local_8038)) == 0x61696c61) {
    return;
  }
  if (CONCAT22(uStack_8033,CONCAT11(local_8034,uStack_8035)) == 0x79726f74 &&
      CONCAT13(uStack_8035,CONCAT12(cStack_8036,local_8038)) == 0x74736968) {
    return;
  }
  if (cStack_8036 == ' ' && local_8038 == 0x6968) {
    return;
  }
  if (cStack_8036 == '\0' && local_8038 == 0x6968) {
    return;
  }
  if (*(char *)((long)&local_8038 + (sVar3 - 1)) == '?') {
    return;
  }
  local_8040 = p->aHistory;
  uVar1 = local_8040->nSize;
  uVar5 = 10;
  if (10 < (int)uVar1) {
    uVar5 = uVar1;
  }
  uVar5 = uVar5 - 10;
  if ((int)uVar5 < (int)uVar1) {
    ppvVar6 = local_8040->pArray + uVar5;
    do {
      __s1 = (char *)*ppvVar6;
      iVar2 = strcmp(__s1,(char *)&local_8038);
      if (iVar2 == 0) goto LAB_002bd377;
      uVar5 = uVar5 + 1;
      ppvVar6 = ppvVar6 + 1;
    } while (uVar1 != uVar5);
  }
  else {
    __s1 = (char *)0x0;
LAB_002bd377:
    if (uVar5 != uVar1) {
      Vec_PtrRemove(local_8040,__s1);
      p_00 = p->aHistory;
      goto LAB_002bd3a4;
    }
  }
  __s1 = Extra_UtilStrsav((char *)&local_8038);
  p_00 = local_8040;
LAB_002bd3a4:
  Vec_PtrPush(p_00,__s1);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Cmd_HistoryAddCommand(	Abc_Frame_t * p, const char * command )
{
    int nLastLooked =   10;  // do not add history if the same entry appears among the last entries
    int nLastSaved  = 1000;  // when saving a file, save no more than this number of last entries
    char Buffer[ABC_MAX_STR];
    int Len;
    if ( p->fBatchMode )
        return;
    Len = strlen(command);
    strcpy( Buffer, command );
    if ( Buffer[Len-1] == '\n' )
        Buffer[Len-1] = 0;
    if ( strlen(Buffer) > 3 &&
         strncmp(Buffer,"set",3) && 
         strncmp(Buffer,"unset",5) && 
         strncmp(Buffer,"time",4) && 
         strncmp(Buffer,"quit",4) && 
         strncmp(Buffer,"alias",5) && 
//         strncmp(Buffer,"source",6) && 
         strncmp(Buffer,"history",7) && strncmp(Buffer,"hi ", 3) && strcmp(Buffer,"hi") &&
         Buffer[strlen(Buffer)-1] != '?' )
    {
        char * pStr = NULL;
        int i, Start = Abc_MaxInt( 0, Vec_PtrSize(p->aHistory) - nLastLooked );
        // do not enter if the same command appears among nLastLooked commands
        Vec_PtrForEachEntryStart( char *, p->aHistory, pStr, i, Start )
            if ( !strcmp(pStr, Buffer) )
                break;
        if ( i == Vec_PtrSize(p->aHistory) )
        { // add new entry
            Vec_PtrPush( p->aHistory, Extra_UtilStrsav(Buffer) );
            Cmd_HistoryWrite( p, nLastSaved );
        }
        else
        { // put at the end
            Vec_PtrRemove( p->aHistory, pStr );
            Vec_PtrPush( p->aHistory, pStr );
        }
    }
}